

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::Parser::LocationRecorder::Init
          (LocationRecorder *this,LocationRecorder *parent)

{
  SourceCodeInfo_Location *pSVar1;
  RepeatedField<int> *this_00;
  RepeatedField<int> *other;
  Token *pTVar2;
  LocationRecorder *parent_local;
  LocationRecorder *this_local;
  
  this->parser_ = parent->parser_;
  pSVar1 = SourceCodeInfo::add_location(this->parser_->source_code_info_);
  this->location_ = pSVar1;
  this_00 = SourceCodeInfo_Location::mutable_path(this->location_);
  other = SourceCodeInfo_Location::path(parent->location_);
  RepeatedField<int>::CopyFrom(this_00,other);
  pSVar1 = this->location_;
  pTVar2 = io::Tokenizer::current(this->parser_->input_);
  SourceCodeInfo_Location::add_span(pSVar1,pTVar2->line);
  pSVar1 = this->location_;
  pTVar2 = io::Tokenizer::current(this->parser_->input_);
  SourceCodeInfo_Location::add_span(pSVar1,pTVar2->column);
  return;
}

Assistant:

void Parser::LocationRecorder::Init(const LocationRecorder& parent) {
  parser_ = parent.parser_;
  location_ = parser_->source_code_info_->add_location();
  location_->mutable_path()->CopyFrom(parent.location_->path());

  location_->add_span(parser_->input_->current().line);
  location_->add_span(parser_->input_->current().column);
}